

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiImporterDesc * aiGetImporterDesc(char *extension)

{
  char *__s1;
  int iVar1;
  size_type sVar2;
  reference ppBVar3;
  undefined4 extraout_var;
  size_t __n;
  undefined4 extraout_var_00;
  ulong local_50;
  size_t i;
  undefined1 local_38 [8];
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> out;
  aiImporterDesc *desc;
  char *extension_local;
  
  if (extension == (char *)0x0) {
    extension_local = (char *)0x0;
  }
  else {
    out.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::vector
              ((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *)local_38);
    Assimp::GetImporterInstanceList
              ((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *)local_38);
    local_50 = 0;
    while( true ) {
      sVar2 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::size
                        ((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *)
                         local_38);
      if (sVar2 <= local_50) break;
      ppBVar3 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
                operator[]((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            *)local_38,local_50);
      iVar1 = (*(*ppBVar3)->_vptr_BaseImporter[5])();
      __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 0x38);
      __n = strlen(extension);
      iVar1 = strncmp(__s1,extension,__n);
      if (iVar1 == 0) {
        ppBVar3 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
                  operator[]((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                              *)local_38,local_50);
        iVar1 = (*(*ppBVar3)->_vptr_BaseImporter[5])();
        out.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_00,iVar1)
        ;
        break;
      }
      local_50 = local_50 + 1;
    }
    Assimp::DeleteImporterInstanceList
              ((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *)local_38);
    extension_local =
         (char *)out.
                 super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::~vector
              ((vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *)local_38);
  }
  return (aiImporterDesc *)extension_local;
}

Assistant:

ASSIMP_API C_STRUCT const aiImporterDesc* aiGetImporterDesc( const char *extension ) {
    if( NULL == extension ) {
        return NULL;
    }
    const aiImporterDesc *desc( NULL );
    std::vector< BaseImporter* > out;
    GetImporterInstanceList( out );
    for( size_t i = 0; i < out.size(); ++i ) {
        if( 0 == strncmp( out[ i ]->GetInfo()->mFileExtensions, extension, strlen( extension ) ) ) {
            desc = out[ i ]->GetInfo();
            break;
        }
    }

    DeleteImporterInstanceList(out);

    return desc;
}